

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

nifti_image * nifti_convert_nhdr2nim(nifti_1_header nhdr,char *fname)

{
  float qfac;
  mat44 mat;
  mat44 R;
  mat44 R_00;
  mat44 mat_00;
  float (*pafVar1) [4];
  short sVar2;
  int iVar3;
  nifti_image *nim;
  uint uVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  int is_nifti;
  float fVar10;
  char *pcVar11;
  byte bVar12;
  float qc;
  float qd;
  float qx;
  float qy;
  float qz;
  short asStackY_ffce [32619];
  mat44 local_78;
  
  bVar12 = 0;
  nim = (nifti_image *)calloc(1,0x2b8);
  if (nim == (nifti_image *)0x0) {
    nifti_convert_nhdr2nim_cold_7();
  }
  else {
    nim->data = (void *)0x0;
    nim->fname = (char *)0x0;
    nim->iname = (char *)0x0;
    iVar3 = need_nhdr_swap(nhdr.dim[0],nhdr.sizeof_hdr);
    if (iVar3 < 0) {
      free(nim);
      if (iVar3 == -1) {
        pcVar9 = "bad dim[0]";
      }
      else {
        pcVar9 = "bad sizeof_hdr";
      }
      fprintf(_stderr,"** ERROR: nifti_convert_nhdr2nim: %s\n",pcVar9);
      return (nifti_image *)0x0;
    }
    is_nifti = 0;
    if (((nhdr.magic[0] == 'n') && (is_nifti = 0, nhdr.magic[3] == '\0')) &&
       ((byte)(nhdr.magic[2] - 0x31U) < 9 && (nhdr.magic[1] == '+' || nhdr.magic[1] == 'i'))) {
      is_nifti = (byte)nhdr.magic[2] - 0x30;
    }
    if (is_nifti == 0) {
      nim->analyze75_orient = (uint)(byte)nhdr.qform_code;
    }
    if (iVar3 != 0) {
      if (3 < g_opts_0) {
        disp_nifti_1_header("-d ni1 pre-swap: ",&nhdr);
      }
      swap_nifti_header(&nhdr,is_nifti);
    }
    if (2 < g_opts_0) {
      disp_nifti_1_header("-d nhdr2nim : ",&nhdr);
    }
    if ((ushort)nhdr.datatype < 2) {
      nifti_convert_nhdr2nim_cold_6();
    }
    else if (nhdr.dim[1] < 1) {
      nifti_convert_nhdr2nim_cold_5();
    }
    else {
      if (1 < nhdr.dim[0]) {
        lVar7 = 0;
        do {
          if (nhdr.dim[lVar7 + 2] < 1) {
            nhdr.dim[lVar7 + 2] = 1;
          }
          lVar7 = lVar7 + 1;
        } while ((ulong)(ushort)nhdr.dim[0] - 1 != lVar7);
      }
      if (nhdr.dim[0] < 7) {
        lVar7 = (long)nhdr.dim[0];
        do {
          if (1 < (ushort)nhdr.dim[lVar7 + 1]) {
            nhdr.dim[lVar7 + 1] = 1;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 7);
      }
      uVar4 = (uint)nhdr.dim[0];
      if (0 < nhdr.dim[0]) {
        uVar8 = 0;
        do {
          fVar10 = ABS(nhdr.pixdim[uVar8 + 1]);
          if ((fVar10 == 0.0 || fVar10 == INFINITY) || 0x7f800000 < (uint)fVar10) {
            nhdr.pixdim[uVar8 + 1] = 1.0;
          }
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
      }
      iVar6 = (nhdr.magic[1] != '+') + 1;
      if (is_nifti == 0) {
        iVar6 = 0;
      }
      nim->nifti_type = iVar6;
      nim->byteorder = 2 - (uint)(iVar3 == 0);
      nim->dim[0] = uVar4;
      nim->ndim = uVar4;
      nim->dim[1] = (int)nhdr.dim[1];
      nim->nx = (int)nhdr.dim[1];
      nim->dim[2] = (int)nhdr.dim[2];
      nim->ny = (int)nhdr.dim[2];
      nim->dim[3] = (int)nhdr.dim[3];
      nim->nz = (int)nhdr.dim[3];
      nim->dim[4] = (int)nhdr.dim[4];
      nim->nt = (int)nhdr.dim[4];
      nim->dim[5] = (int)nhdr.dim[5];
      nim->nu = (int)nhdr.dim[5];
      nim->dim[6] = (int)nhdr.dim[6];
      nim->nv = (int)nhdr.dim[6];
      nim->dim[7] = (int)nhdr.dim[7];
      nim->nw = (int)nhdr.dim[7];
      nim->nvox = 1;
      if (0 < nhdr.dim[0]) {
        sVar5 = nim->nvox;
        uVar8 = 0;
        do {
          sVar5 = sVar5 * (long)nhdr.dim[uVar8 + 1];
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
        nim->nvox = sVar5;
      }
      nim->datatype = (int)nhdr.datatype;
      nifti_datatype_sizes((int)nhdr.datatype,&nim->nbyper,&nim->swapsize);
      if (nim->nbyper != 0) {
        nim->pixdim[1] = nhdr.pixdim[1];
        nim->dx = nhdr.pixdim[1];
        nim->pixdim[2] = nhdr.pixdim[2];
        nim->dy = nhdr.pixdim[2];
        nim->pixdim[3] = nhdr.pixdim[3];
        nim->dz = nhdr.pixdim[3];
        nim->pixdim[4] = nhdr.pixdim[4];
        nim->dt = nhdr.pixdim[4];
        nim->pixdim[5] = nhdr.pixdim[5];
        nim->du = nhdr.pixdim[5];
        nim->pixdim[6] = nhdr.pixdim[6];
        nim->dv = nhdr.pixdim[6];
        nim->pixdim[7] = nhdr.pixdim[7];
        nim->dw = nhdr.pixdim[7];
        if ((is_nifti == 0) || (CONCAT11(nhdr.qform_code._1_1_,(byte)nhdr.qform_code) < 1)) {
          (nim->qto_xyz).m[0][0] = nhdr.pixdim[1];
          (nim->qto_xyz).m[1][1] = nhdr.pixdim[2];
          (nim->qto_xyz).m[2][2] = nhdr.pixdim[3];
          *(float *)((long)((nim->qto_xyz).m + 0) + 4) = 0.0;
          *(float *)((long)((nim->qto_xyz).m + 0) + 8) = 0.0;
          *(undefined8 *)((nim->qto_xyz).m[0] + 3) = 0;
          pafVar1 = (nim->qto_xyz).m;
          *(float *)((long)(pafVar1 + 1) + 8) = 0.0;
          *(float *)((long)(pafVar1 + 1) + 0xc) = 0.0;
          *(float *)((long)((nim->qto_xyz).m + 2) + 0) = 0.0;
          *(float *)((long)((nim->qto_xyz).m + 2) + 4) = 0.0;
          *(undefined8 *)((nim->qto_xyz).m[2] + 3) = 0;
          pafVar1 = (nim->qto_xyz).m;
          *(float *)((long)(pafVar1 + 3) + 4) = 0.0;
          *(float *)((long)(pafVar1 + 3) + 8) = 0.0;
          (nim->qto_xyz).m[3][3] = 1.0;
          nim->qform_code = 0;
          if (1 < g_opts_0) {
            nifti_convert_nhdr2nim_cold_1();
          }
        }
        else {
          fVar10 = nhdr.quatern_b;
          if (0x7f7fffff < (uint)ABS(nhdr.quatern_b)) {
            fVar10 = 0.0;
          }
          nim->quatern_b = fVar10;
          qc = nhdr.quatern_c;
          if (0x7f7fffff < (uint)ABS(nhdr.quatern_c)) {
            qc = 0.0;
          }
          nim->quatern_c = qc;
          qd = nhdr.quatern_d;
          if (0x7f7fffff < (uint)ABS(nhdr.quatern_d)) {
            qd = 0.0;
          }
          nim->quatern_d = qd;
          qx = nhdr.qoffset_x;
          if (0x7f7fffff < (uint)ABS(nhdr.qoffset_x)) {
            qx = 0.0;
          }
          nim->qoffset_x = qx;
          qy = nhdr.qoffset_y;
          if (0x7f7fffff < (uint)ABS(nhdr.qoffset_y)) {
            qy = 0.0;
          }
          nim->qoffset_y = qy;
          qz = nhdr.qoffset_z;
          if (0x7f7fffff < (uint)ABS(nhdr.qoffset_z)) {
            qz = 0.0;
          }
          nim->qoffset_z = qz;
          qfac = *(float *)(&DAT_001140b0 + (ulong)(nhdr.pixdim[0] < 0.0) * 4);
          nim->qfac = qfac;
          nifti_quatern_to_mat44
                    (&local_78,fVar10,qc,qd,qx,qy,qz,nhdr.pixdim[1],nhdr.pixdim[2],nhdr.pixdim[3],
                     qfac);
          *(undefined8 *)(nim->qto_xyz).m[3] = local_78.m[3]._0_8_;
          *(undefined8 *)((nim->qto_xyz).m[3] + 2) = local_78.m[3]._8_8_;
          *(undefined8 *)(nim->qto_xyz).m[2] = local_78.m[2]._0_8_;
          *(undefined8 *)((nim->qto_xyz).m[2] + 2) = local_78.m[2]._8_8_;
          *(undefined8 *)(nim->qto_xyz).m[1] = local_78.m[1]._0_8_;
          *(undefined8 *)((nim->qto_xyz).m[1] + 2) = local_78.m[1]._8_8_;
          *(undefined8 *)(nim->qto_xyz).m[0] = local_78.m[0]._0_8_;
          *(undefined8 *)((nim->qto_xyz).m[0] + 2) = local_78.m[0]._8_8_;
          nim->qform_code = (int)CONCAT11(nhdr.qform_code._1_1_,(byte)nhdr.qform_code);
          if (1 < g_opts_0) {
            local_78.m[0]._0_8_ = *(undefined8 *)(nim->qto_xyz).m[0];
            local_78.m[0]._8_8_ = *(undefined8 *)((nim->qto_xyz).m[0] + 2);
            local_78.m[1]._0_8_ = *(undefined8 *)(nim->qto_xyz).m[1];
            local_78.m[1]._8_8_ = *(undefined8 *)((nim->qto_xyz).m[1] + 2);
            local_78.m[2]._0_8_ = *(undefined8 *)(nim->qto_xyz).m[2];
            local_78.m[2]._8_8_ = *(undefined8 *)((nim->qto_xyz).m[2] + 2);
            local_78.m[3]._0_8_ = *(undefined8 *)(nim->qto_xyz).m[3];
            local_78.m[3]._8_8_ = *(undefined8 *)((nim->qto_xyz).m[3] + 2);
            mat.m[0][3] = local_78.m[0][3];
            mat.m[0]._0_12_ = *(undefined1 (*) [12])(nim->qto_xyz).m[0];
            mat.m[1][0] = local_78.m[1][0];
            mat.m[1][1] = local_78.m[1][1];
            mat.m[1][2] = local_78.m[1][2];
            mat.m[1][3] = local_78.m[1][3];
            mat.m[2][0] = local_78.m[2][0];
            mat.m[2][1] = local_78.m[2][1];
            mat.m[2][2] = local_78.m[2][2];
            mat.m[2][3] = local_78.m[2][3];
            mat.m[3][0] = local_78.m[3][0];
            mat.m[3][1] = local_78.m[3][1];
            mat.m[3][2] = local_78.m[3][2];
            mat.m[3][3] = local_78.m[3][3];
            nifti_disp_matrix_orient("-d qform orientations:\n",mat);
          }
        }
        R.m[0][3] = (float)(int)((ulong)*(undefined8 *)((nim->qto_xyz).m[0] + 2) >> 0x20);
        R.m[0]._0_12_ = *(undefined1 (*) [12])(nim->qto_xyz).m[0];
        R.m[1]._0_8_ = *(undefined8 *)(nim->qto_xyz).m[1];
        R.m[1]._8_8_ = *(undefined8 *)((nim->qto_xyz).m[1] + 2);
        R.m[2]._0_8_ = *(undefined8 *)(nim->qto_xyz).m[2];
        R.m[2]._8_8_ = *(undefined8 *)((nim->qto_xyz).m[2] + 2);
        R.m[3]._0_8_ = *(undefined8 *)(nim->qto_xyz).m[3];
        R.m[3]._8_8_ = *(undefined8 *)((nim->qto_xyz).m[3] + 2);
        nifti_mat44_inverse(R);
        sVar2 = nhdr.sform_code;
        *(undefined8 *)(nim->qto_ijk).m[3] = local_78.m[3]._0_8_;
        *(undefined8 *)((nim->qto_ijk).m[3] + 2) = local_78.m[3]._8_8_;
        *(undefined8 *)(nim->qto_ijk).m[2] = local_78.m[2]._0_8_;
        *(undefined8 *)((nim->qto_ijk).m[2] + 2) = local_78.m[2]._8_8_;
        *(undefined8 *)(nim->qto_ijk).m[1] = local_78.m[1]._0_8_;
        *(undefined8 *)((nim->qto_ijk).m[1] + 2) = local_78.m[1]._8_8_;
        *(undefined8 *)(nim->qto_ijk).m[0] = local_78.m[0]._0_8_;
        *(undefined8 *)((nim->qto_ijk).m[0] + 2) = local_78.m[0]._8_8_;
        if (nhdr.sform_code < 1 || is_nifti == 0) {
          nim->sform_code = 0;
          if (1 < g_opts_0) {
            nifti_convert_nhdr2nim_cold_2();
          }
        }
        else {
          (nim->sto_xyz).m[0][0] = nhdr.srow_x[0];
          (nim->sto_xyz).m[0][1] = nhdr.srow_x[1];
          (nim->sto_xyz).m[0][2] = nhdr.srow_x[2];
          (nim->sto_xyz).m[0][3] = nhdr.srow_x[3];
          (nim->sto_xyz).m[1][0] = nhdr.srow_y[0];
          (nim->sto_xyz).m[1][1] = nhdr.srow_y[1];
          (nim->sto_xyz).m[1][2] = nhdr.srow_y[2];
          (nim->sto_xyz).m[1][3] = nhdr.srow_y[3];
          (nim->sto_xyz).m[2][0] = nhdr.srow_z[0];
          (nim->sto_xyz).m[2][1] = nhdr.srow_z[1];
          (nim->sto_xyz).m[2][2] = nhdr.srow_z[2];
          (nim->sto_xyz).m[2][3] = nhdr.srow_z[3];
          pafVar1 = (nim->sto_xyz).m;
          *(float *)((long)(pafVar1 + 3) + 8) = 0.0;
          *(float *)((long)(pafVar1 + 3) + 0xc) = 1.0;
          *(float *)((long)((nim->sto_xyz).m + 3) + 0) = 0.0;
          *(float *)((long)((nim->sto_xyz).m + 3) + 4) = 0.0;
          R_00.m[0][3] = (float)(int)((ulong)*(undefined8 *)((nim->sto_xyz).m[0] + 2) >> 0x20);
          R_00.m[0]._0_12_ = *(undefined1 (*) [12])(nim->sto_xyz).m[0];
          R_00.m[1]._0_8_ = *(undefined8 *)(nim->sto_xyz).m[1];
          R_00.m[1]._8_8_ = *(undefined8 *)((nim->sto_xyz).m[1] + 2);
          R_00.m[2]._0_8_ = *(undefined8 *)(nim->sto_xyz).m[2];
          R_00.m[2]._8_8_ = *(undefined8 *)((nim->sto_xyz).m[2] + 2);
          R_00.m[3]._0_8_ = *(undefined8 *)(nim->sto_xyz).m[3];
          R_00.m[3]._8_8_ = *(undefined8 *)((nim->sto_xyz).m[3] + 2);
          nifti_mat44_inverse(R_00);
          *(undefined8 *)(nim->sto_ijk).m[3] = local_78.m[3]._0_8_;
          *(undefined8 *)((nim->sto_ijk).m[3] + 2) = local_78.m[3]._8_8_;
          *(undefined8 *)(nim->sto_ijk).m[2] = local_78.m[2]._0_8_;
          *(undefined8 *)((nim->sto_ijk).m[2] + 2) = local_78.m[2]._8_8_;
          *(undefined8 *)(nim->sto_ijk).m[1] = local_78.m[1]._0_8_;
          *(undefined8 *)((nim->sto_ijk).m[1] + 2) = local_78.m[1]._8_8_;
          *(undefined8 *)(nim->sto_ijk).m[0] = local_78.m[0]._0_8_;
          *(undefined8 *)((nim->sto_ijk).m[0] + 2) = local_78.m[0]._8_8_;
          nim->sform_code = (uint)(ushort)sVar2;
          if (1 < g_opts_0) {
            local_78.m[0]._0_8_ = *(undefined8 *)(nim->sto_xyz).m[0];
            local_78.m[0]._8_8_ = *(undefined8 *)((nim->sto_xyz).m[0] + 2);
            local_78.m[1]._0_8_ = *(undefined8 *)(nim->sto_xyz).m[1];
            local_78.m[1]._8_8_ = *(undefined8 *)((nim->sto_xyz).m[1] + 2);
            local_78.m[2]._0_8_ = *(undefined8 *)(nim->sto_xyz).m[2];
            local_78.m[2]._8_8_ = *(undefined8 *)((nim->sto_xyz).m[2] + 2);
            local_78.m[3]._0_8_ = *(undefined8 *)(nim->sto_xyz).m[3];
            local_78.m[3]._8_8_ = *(undefined8 *)((nim->sto_xyz).m[3] + 2);
            mat_00.m[0][3] = local_78.m[0][3];
            mat_00.m[0]._0_12_ = *(undefined1 (*) [12])(nim->sto_xyz).m[0];
            mat_00.m[1][0] = local_78.m[1][0];
            mat_00.m[1][1] = local_78.m[1][1];
            mat_00.m[1][2] = local_78.m[1][2];
            mat_00.m[1][3] = local_78.m[1][3];
            mat_00.m[2][0] = local_78.m[2][0];
            mat_00.m[2][1] = local_78.m[2][1];
            mat_00.m[2][2] = local_78.m[2][2];
            mat_00.m[2][3] = local_78.m[2][3];
            mat_00.m[3][0] = local_78.m[3][0];
            mat_00.m[3][1] = local_78.m[3][1];
            mat_00.m[3][2] = local_78.m[3][2];
            mat_00.m[3][3] = local_78.m[3][3];
            nifti_disp_matrix_orient("-d sform orientations:\n",mat_00);
          }
        }
        if (is_nifti != 0) {
          fVar10 = nhdr.scl_slope;
          if (0x7f7fffff < (uint)ABS(nhdr.scl_slope)) {
            fVar10 = 0.0;
          }
          nim->scl_slope = fVar10;
          fVar10 = nhdr.scl_inter;
          if (0x7f7fffff < (uint)ABS(nhdr.scl_inter)) {
            fVar10 = 0.0;
          }
          nim->scl_inter = fVar10;
          nim->intent_code = (int)nhdr.intent_code;
          fVar10 = nhdr.intent_p1;
          if (0x7f7fffff < (uint)ABS(nhdr.intent_p1)) {
            fVar10 = 0.0;
          }
          nim->intent_p1 = fVar10;
          fVar10 = nhdr.intent_p2;
          if (0x7f7fffff < (uint)ABS(nhdr.intent_p2)) {
            fVar10 = 0.0;
          }
          nim->intent_p2 = fVar10;
          fVar10 = nhdr.intent_p3;
          if (0x7f7fffff < (uint)ABS(nhdr.intent_p3)) {
            fVar10 = 0.0;
          }
          nim->intent_p3 = fVar10;
          fVar10 = nhdr.toffset;
          if (0x7f7fffff < (uint)ABS(nhdr.toffset)) {
            fVar10 = 0.0;
          }
          nim->toffset = fVar10;
          *(ulong *)nim->intent_name = CONCAT17(nhdr.intent_name[7],nhdr.intent_name._0_7_);
          *(ulong *)(nim->intent_name + 7) = CONCAT71(nhdr.intent_name._8_7_,nhdr.intent_name[7]);
          nim->intent_name[0xf] = '\0';
          nim->xyz_units = (byte)nhdr.xyzt_units & 7;
          nim->time_units = (byte)nhdr.xyzt_units & 0x38;
          nim->freq_dim = (byte)nhdr.dim_info & 3;
          nim->phase_dim = (byte)nhdr.dim_info >> 2 & 3;
          nim->slice_dim = (byte)nhdr.dim_info >> 4 & 3;
          nim->slice_code = (int)nhdr.slice_code;
          nim->slice_start = (int)nhdr.slice_start;
          nim->slice_end = (int)nhdr.slice_end;
          fVar10 = nhdr.slice_duration;
          if (0x7f7fffff < (uint)ABS(nhdr.slice_duration)) {
            fVar10 = 0.0;
          }
          nim->slice_duration = fVar10;
        }
        fVar10 = nhdr.cal_min;
        if (0x7f7fffff < (uint)ABS(nhdr.cal_min)) {
          fVar10 = 0.0;
        }
        nim->cal_min = fVar10;
        fVar10 = nhdr.cal_max;
        if (0x7f7fffff < (uint)ABS(nhdr.cal_max)) {
          fVar10 = 0.0;
        }
        nim->cal_max = fVar10;
        pcVar9 = nhdr.descrip;
        pcVar11 = nim->descrip;
        for (lVar7 = 0x13; lVar7 != 0; lVar7 = lVar7 + -1) {
          *(undefined4 *)pcVar11 = *(undefined4 *)pcVar9;
          pcVar9 = pcVar9 + (ulong)bVar12 * -8 + 4;
          pcVar11 = pcVar11 + (ulong)bVar12 * -8 + 4;
        }
        *(undefined2 *)(nim->descrip + 0x4c) = nhdr.descrip._76_2_;
        nim->descrip[0x4e] = nhdr.descrip[0x4e];
        nim->descrip[0x4f] = '\0';
        *(undefined8 *)nim->aux_file = nhdr.aux_file._0_8_;
        *(ulong *)(nim->aux_file + 8) = CONCAT17(nhdr.aux_file[0xf],nhdr.aux_file._8_7_);
        iVar6 = (int)nhdr.vox_offset;
        *(ulong *)(nim->aux_file + 0xf) = CONCAT71(nhdr.aux_file._16_7_,nhdr.aux_file[0xf]);
        iVar3 = 0x15c;
        if (0x15c < iVar6) {
          iVar3 = iVar6;
        }
        nim->aux_file[0x17] = '\0';
        if (nhdr.magic[1] != '+') {
          iVar3 = iVar6;
        }
        if (is_nifti == 0) {
          iVar3 = iVar6;
        }
        nim->iname_offset = iVar3;
        if (fname == (char *)0x0) {
          nim->fname = (char *)0x0;
          nim->iname = (char *)0x0;
        }
        else {
          nifti_set_filenames(nim,fname,0,0);
          if (nim->iname == (char *)0x0) {
            nifti_convert_nhdr2nim_cold_3();
            return (nifti_image *)0x0;
          }
        }
        nim->num_ext = 0;
        nim->ext_list = (nifti1_extension *)0x0;
        return nim;
      }
      nifti_convert_nhdr2nim_cold_4();
    }
  }
  return (nifti_image *)0x0;
}

Assistant:

nifti_image* nifti_convert_nhdr2nim(struct nifti_1_header nhdr,
                                    const char * fname)
{
   int   ii , doswap , ioff ;
   int   is_nifti , is_onefile ;
   nifti_image *nim;

   nim = (nifti_image *)calloc( 1 , sizeof(nifti_image) ) ;
   if( !nim ) ERREX("failed to allocate nifti image");

   /* be explicit with pointers */
   nim->fname = NULL;
   nim->iname = NULL;
   nim->data = NULL;

   /**- check if we must swap bytes */

   doswap = need_nhdr_swap(nhdr.dim[0], nhdr.sizeof_hdr); /* swap data flag */

   if( doswap < 0 ){
      free(nim);
      if( doswap == -1 ) ERREX("bad dim[0]") ;
      ERREX("bad sizeof_hdr") ;  /* else */
   }

   /**- determine if this is a NIFTI-1 compliant header */

   is_nifti = NIFTI_VERSION(nhdr) ;
   /*
    * before swapping header, record the Analyze75 orient code
    */
   if(!is_nifti)
     {
     /**- in analyze75, the orient code is at the same address as
      *   qform_code, but it's just one byte
      *   the qform_code will be zero, at which point you can check
      *   analyze75_orient if you care to.
      */
     unsigned char c = *((char *)(&nhdr.qform_code));
     nim->analyze75_orient = (analyze_75_orient_code)c;
     }
   if( doswap ) {
      if ( g_opts.debug > 3 ) disp_nifti_1_header("-d ni1 pre-swap: ", &nhdr);
      swap_nifti_header( &nhdr , is_nifti ) ;
   }

   if ( g_opts.debug > 2 ) disp_nifti_1_header("-d nhdr2nim : ", &nhdr);

   if( nhdr.datatype == DT_BINARY || nhdr.datatype == DT_UNKNOWN  )
   {
     free(nim);
     ERREX("bad datatype") ;
   }

   if( nhdr.dim[1] <= 0 )
   {
     free(nim);
     ERREX("bad dim[1]") ;
   }

   /* fix bad dim[] values in the defined dimension range */
   for( ii=2 ; ii <= nhdr.dim[0] ; ii++ )
     if( nhdr.dim[ii] <= 0 ) nhdr.dim[ii] = 1 ;

   /* fix any remaining bad dim[] values, so garbage does not propagate */
   /* (only values 0 or 1 seem rational, otherwise set to arbirary 1)   */
   for( ii=nhdr.dim[0]+1 ; ii <= 7 ; ii++ )
     if( nhdr.dim[ii] != 1 && nhdr.dim[ii] != 0) nhdr.dim[ii] = 1 ;

#if 0  /* rely on dim[0], do not attempt to modify it   16 Nov 2005 [rickr] */

   /**- get number of dimensions (ignoring dim[0] now) */
   for( ii=7 ; ii >= 2 ; ii-- )            /* loop backwards until we  */
     if( nhdr.dim[ii] > 1 ) break ;        /* find a dim bigger than 1 */
   ndim = ii ;
#endif

   /**- set bad grid spacings to 1.0 */

   for( ii=1 ; ii <= nhdr.dim[0] ; ii++ ){
     if( nhdr.pixdim[ii] == 0.0         ||
         !IS_GOOD_FLOAT(nhdr.pixdim[ii])  ) nhdr.pixdim[ii] = 1.0f ;
   }

  is_onefile = is_nifti && NIFTI_ONEFILE(nhdr) ;

  if( is_nifti ) nim->nifti_type = (is_onefile) ? NIFTI_FTYPE_NIFTI1_1
                                                : NIFTI_FTYPE_NIFTI1_2 ;
  else           nim->nifti_type = NIFTI_FTYPE_ANALYZE ;

  ii = nifti_short_order() ;
  if( doswap )   nim->byteorder = REVERSE_ORDER(ii) ;
  else           nim->byteorder = ii ;


  /**- set dimensions of data array */

  nim->ndim = nim->dim[0] = nhdr.dim[0];
  nim->nx   = nim->dim[1] = nhdr.dim[1];
  nim->ny   = nim->dim[2] = nhdr.dim[2];
  nim->nz   = nim->dim[3] = nhdr.dim[3];
  nim->nt   = nim->dim[4] = nhdr.dim[4];
  nim->nu   = nim->dim[5] = nhdr.dim[5];
  nim->nv   = nim->dim[6] = nhdr.dim[6];
  nim->nw   = nim->dim[7] = nhdr.dim[7];

  for( ii=1, nim->nvox=1; ii <= nhdr.dim[0]; ii++ )
     nim->nvox *= nhdr.dim[ii];

  /**- set the type of data in voxels and how many bytes per voxel */

  nim->datatype = nhdr.datatype ;

  nifti_datatype_sizes( nim->datatype , &(nim->nbyper) , &(nim->swapsize) ) ;
  if( nim->nbyper == 0 ){ free(nim); ERREX("bad datatype"); }

  /**- set the grid spacings */

  nim->dx = nim->pixdim[1] = nhdr.pixdim[1] ;
  nim->dy = nim->pixdim[2] = nhdr.pixdim[2] ;
  nim->dz = nim->pixdim[3] = nhdr.pixdim[3] ;
  nim->dt = nim->pixdim[4] = nhdr.pixdim[4] ;
  nim->du = nim->pixdim[5] = nhdr.pixdim[5] ;
  nim->dv = nim->pixdim[6] = nhdr.pixdim[6] ;
  nim->dw = nim->pixdim[7] = nhdr.pixdim[7] ;

  /**- compute qto_xyz transformation from pixel indexes (i,j,k) to (x,y,z) */

  if( !is_nifti || nhdr.qform_code <= 0 ){
    /**- if not nifti or qform_code <= 0, use grid spacing for qto_xyz */

    nim->qto_xyz.m[0][0] = nim->dx ;  /* grid spacings */
    nim->qto_xyz.m[1][1] = nim->dy ;  /* along diagonal */
    nim->qto_xyz.m[2][2] = nim->dz ;

    /* off diagonal is zero */

    nim->qto_xyz.m[0][1]=nim->qto_xyz.m[0][2]=nim->qto_xyz.m[0][3] = 0.0f;
    nim->qto_xyz.m[1][0]=nim->qto_xyz.m[1][2]=nim->qto_xyz.m[1][3] = 0.0f;
    nim->qto_xyz.m[2][0]=nim->qto_xyz.m[2][1]=nim->qto_xyz.m[2][3] = 0.0f;

    /* last row is always [ 0 0 0 1 ] */

    nim->qto_xyz.m[3][0]=nim->qto_xyz.m[3][1]=nim->qto_xyz.m[3][2] = 0.0f;
    nim->qto_xyz.m[3][3]= 1.0f ;

    nim->qform_code = NIFTI_XFORM_UNKNOWN ;

    if( g_opts.debug > 1 ) fprintf(stderr,"-d no qform provided\n");
  } else {
    /**- else NIFTI: use the quaternion-specified transformation */

    nim->quatern_b = FIXED_FLOAT( nhdr.quatern_b ) ;
    nim->quatern_c = FIXED_FLOAT( nhdr.quatern_c ) ;
    nim->quatern_d = FIXED_FLOAT( nhdr.quatern_d ) ;

    nim->qoffset_x = FIXED_FLOAT(nhdr.qoffset_x) ;
    nim->qoffset_y = FIXED_FLOAT(nhdr.qoffset_y) ;
    nim->qoffset_z = FIXED_FLOAT(nhdr.qoffset_z) ;

    nim->qfac = (nhdr.pixdim[0] < 0.0) ? -1.0f : 1.0f ;  /* left-handedness? */

    nim->qto_xyz = nifti_quatern_to_mat44(
                      nim->quatern_b, nim->quatern_c, nim->quatern_d,
                      nim->qoffset_x, nim->qoffset_y, nim->qoffset_z,
                      nim->dx       , nim->dy       , nim->dz       ,
                      nim->qfac                                      ) ;

    nim->qform_code = nhdr.qform_code ;

    if( g_opts.debug > 1 )
       nifti_disp_matrix_orient("-d qform orientations:\n", nim->qto_xyz);
  }

  /**- load inverse transformation (x,y,z) -> (i,j,k) */

  nim->qto_ijk = nifti_mat44_inverse( nim->qto_xyz ) ;

  /**- load sto_xyz affine transformation, if present */

  if( !is_nifti || nhdr.sform_code <= 0 ){
    /**- if not nifti or sform_code <= 0, then no sto transformation */

    nim->sform_code = NIFTI_XFORM_UNKNOWN ;

    if( g_opts.debug > 1 ) fprintf(stderr,"-d no sform provided\n");

  } else {
    /**- else set the sto transformation from srow_*[] */

    nim->sto_xyz.m[0][0] = nhdr.srow_x[0] ;
    nim->sto_xyz.m[0][1] = nhdr.srow_x[1] ;
    nim->sto_xyz.m[0][2] = nhdr.srow_x[2] ;
    nim->sto_xyz.m[0][3] = nhdr.srow_x[3] ;

    nim->sto_xyz.m[1][0] = nhdr.srow_y[0] ;
    nim->sto_xyz.m[1][1] = nhdr.srow_y[1] ;
    nim->sto_xyz.m[1][2] = nhdr.srow_y[2] ;
    nim->sto_xyz.m[1][3] = nhdr.srow_y[3] ;

    nim->sto_xyz.m[2][0] = nhdr.srow_z[0] ;
    nim->sto_xyz.m[2][1] = nhdr.srow_z[1] ;
    nim->sto_xyz.m[2][2] = nhdr.srow_z[2] ;
    nim->sto_xyz.m[2][3] = nhdr.srow_z[3] ;

    /* last row is always [ 0 0 0 1 ] */

    nim->sto_xyz.m[3][0]=nim->sto_xyz.m[3][1]=nim->sto_xyz.m[3][2] = 0.0f;
    nim->sto_xyz.m[3][3]= 1.0f ;

    nim->sto_ijk = nifti_mat44_inverse( nim->sto_xyz ) ;

    nim->sform_code = nhdr.sform_code ;

    if( g_opts.debug > 1 )
       nifti_disp_matrix_orient("-d sform orientations:\n", nim->sto_xyz);
  }

  /**- set miscellaneous NIFTI stuff */

  if( is_nifti ){
    nim->scl_slope   = FIXED_FLOAT( nhdr.scl_slope ) ;
    nim->scl_inter   = FIXED_FLOAT( nhdr.scl_inter ) ;

    nim->intent_code = nhdr.intent_code ;

    nim->intent_p1 = FIXED_FLOAT( nhdr.intent_p1 ) ;
    nim->intent_p2 = FIXED_FLOAT( nhdr.intent_p2 ) ;
    nim->intent_p3 = FIXED_FLOAT( nhdr.intent_p3 ) ;

    nim->toffset   = FIXED_FLOAT( nhdr.toffset ) ;

    memcpy(nim->intent_name,nhdr.intent_name,15); nim->intent_name[15] = '\0';

    nim->xyz_units  = XYZT_TO_SPACE(nhdr.xyzt_units) ;
    nim->time_units = XYZT_TO_TIME (nhdr.xyzt_units) ;

    nim->freq_dim  = DIM_INFO_TO_FREQ_DIM ( nhdr.dim_info ) ;
    nim->phase_dim = DIM_INFO_TO_PHASE_DIM( nhdr.dim_info ) ;
    nim->slice_dim = DIM_INFO_TO_SLICE_DIM( nhdr.dim_info ) ;

    nim->slice_code     = nhdr.slice_code  ;
    nim->slice_start    = nhdr.slice_start ;
    nim->slice_end      = nhdr.slice_end   ;
    nim->slice_duration = FIXED_FLOAT(nhdr.slice_duration) ;
  }

  /**- set Miscellaneous ANALYZE stuff */

  nim->cal_min = FIXED_FLOAT(nhdr.cal_min) ;
  nim->cal_max = FIXED_FLOAT(nhdr.cal_max) ;

  memcpy(nim->descrip ,nhdr.descrip ,79) ; nim->descrip [79] = '\0' ;
  memcpy(nim->aux_file,nhdr.aux_file,23) ; nim->aux_file[23] = '\0' ;

   /**- set ioff from vox_offset (but at least sizeof(header)) */

   is_onefile = is_nifti && NIFTI_ONEFILE(nhdr) ;

   if( is_onefile ){
     ioff = (int)nhdr.vox_offset ;
     if( ioff < (int) sizeof(nhdr) ) ioff = (int) sizeof(nhdr) ;
   } else {
     ioff = (int)nhdr.vox_offset ;
   }
   nim->iname_offset = ioff ;


   /**- deal with file names if set */
   if (fname!=NULL) {
       nifti_set_filenames(nim,fname,0,0);
       if (nim->iname==NULL)  { ERREX("bad filename"); }
   } else {
     nim->fname = NULL;
     nim->iname = NULL;
   }

   /* clear extension fields */
   nim->num_ext = 0;
   nim->ext_list = NULL;

   return nim;
}